

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeDylinkSection(WasmBinaryWriter *this)

{
  string_view *psVar1;
  pointer pcVar2;
  pointer pcVar3;
  undefined *puVar4;
  int32_t start;
  int32_t iVar5;
  size_t sVar6;
  DylinkSection *pDVar7;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  Name *neededDynlib;
  string_view *psVar8;
  long lVar9;
  string_view name;
  LEB<unsigned_int,_unsigned_char> local_34;
  
  pDVar7 = (this->wasm->dylinkSection)._M_t.
           super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
           super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
  if (pDVar7 != (DylinkSection *)0x0) {
    if (pDVar7->isLegacy == true) {
      writeLegacyDylinkSection(this);
      return;
    }
    start = startSection<wasm::BinaryConsts::Section>(this,Custom);
    puVar4 = BinaryConsts::CustomSections::Dylink0;
    sVar6 = strlen(BinaryConsts::CustomSections::Dylink0);
    name._M_str = puVar4;
    name._M_len = sVar6;
    writeInlineString(this,name);
    iVar5 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkMemInfo);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf,in_RCX);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_00,in_RCX);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_01,in_RCX);
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_02,in_RCX);
    finishSection(this,iVar5);
    pDVar7 = (this->wasm->dylinkSection)._M_t.
             super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
             _M_t.
             super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
             .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    if (*(pointer *)
         ((long)&(pDVar7->neededDynlibs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
         + 8) != *(pointer *)
                  &(pDVar7->neededDynlibs).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl) {
      iVar5 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkNeeded);
      pDVar7 = (this->wasm->dylinkSection)._M_t.
               super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
               .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
      LEB<unsigned_int,_unsigned_char>::write
                (&local_34,(int)this->o,__buf_03,
                 (ulong)((long)*(pointer *)
                                ((long)&(pDVar7->neededDynlibs).
                                        super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                + 8) -
                        *(long *)&(pDVar7->neededDynlibs).
                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl) >> 4);
      pDVar7 = (this->wasm->dylinkSection)._M_t.
               super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
               .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
      psVar1 = *(string_view **)
                ((long)&(pDVar7->neededDynlibs).
                        super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_> + 8);
      for (psVar8 = *(string_view **)
                     &(pDVar7->neededDynlibs).
                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl;
          psVar8 != psVar1; psVar8 = psVar8 + 1) {
        writeInlineString(this,*psVar8);
      }
      finishSection(this,iVar5);
      pDVar7 = (this->wasm->dylinkSection)._M_t.
               super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
               .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    }
    pcVar2 = (pDVar7->tail).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = *(pointer *)
              ((long)&(pDVar7->tail).super__Vector_base<char,_std::allocator<char>_>._M_impl + 8);
    if (pcVar3 != pcVar2) {
      lVar9 = 0;
      do {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (uchar *)&local_34);
        lVar9 = lVar9 + 1;
      } while ((long)pcVar3 - (long)pcVar2 != lVar9);
    }
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDylinkSection() {
  if (!wasm->dylinkSection) {
    return;
  }

  if (wasm->dylinkSection->isLegacy) {
    writeLegacyDylinkSection();
    return;
  }

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::Dylink0);

  auto substart =
    startSubsection(BinaryConsts::CustomSections::Subsection::DylinkMemInfo);
  o << U32LEB(wasm->dylinkSection->memorySize);
  o << U32LEB(wasm->dylinkSection->memoryAlignment);
  o << U32LEB(wasm->dylinkSection->tableSize);
  o << U32LEB(wasm->dylinkSection->tableAlignment);
  finishSubsection(substart);

  if (wasm->dylinkSection->neededDynlibs.size()) {
    substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::DylinkNeeded);
    o << U32LEB(wasm->dylinkSection->neededDynlibs.size());
    for (auto& neededDynlib : wasm->dylinkSection->neededDynlibs) {
      writeInlineString(neededDynlib.str);
    }
    finishSubsection(substart);
  }

  writeData(wasm->dylinkSection->tail.data(), wasm->dylinkSection->tail.size());
  finishSection(start);
}